

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O0

FtpSession * __thiscall fineftp::FtpSession::toLocalPath(FtpSession *this,string *ftp_path)

{
  bool bVar1;
  element_type *peVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [32];
  string local_60;
  undefined1 local_40 [8];
  string absolute_ftp_path;
  string *ftp_path_local;
  FtpSession *this_local;
  
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(ftp_path + 0x38));
  if (!bVar1) {
    __assert_fail("logged_in_user_",
                  "/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/ftp_session.cpp"
                  ,0x55e,"std::string fineftp::FtpSession::toLocalPath(const std::string &) const");
  }
  toAbsoluteFtpPath((FtpSession *)local_40,ftp_path);
  peVar2 = ::std::__shared_ptr_access<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)(ftp_path + 0x38));
  ::std::operator+(local_80,(char *)&peVar2->local_root_path_);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60,
                   local_80);
  Filesystem::cleanPathNative((string *)this,&local_60);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::__cxx11::string::~string((string *)local_80);
  ::std::__cxx11::string::~string((string *)local_40);
  return this;
}

Assistant:

std::string FtpSession::toLocalPath(const std::string& ftp_path) const
  {
    assert(logged_in_user_);

    // First make the ftp path absolute if it isn't already
    std::string absolute_ftp_path = toAbsoluteFtpPath(ftp_path);

    // Now map it to the local filesystem
    return fineftp::Filesystem::cleanPathNative(logged_in_user_->local_root_path_ + "/" + absolute_ftp_path);
  }